

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall MyDocument::MyDocument(MyDocument *this,char *name,bool open,ImVec4 *color)

{
  undefined8 *in_RCX;
  byte in_DL;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  ImVec4::ImVec4((ImVec4 *)((long)in_RDI + 0xc));
  *in_RDI = in_RSI;
  *(byte *)((long)in_RDI + 9) = in_DL & 1;
  *(byte *)(in_RDI + 1) = in_DL & 1;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0xb) = 0;
  *(undefined8 *)((long)in_RDI + 0xc) = *in_RCX;
  *(undefined8 *)((long)in_RDI + 0x14) = in_RCX[1];
  return;
}

Assistant:

MyDocument(const char* name, bool open = true, const ImVec4& color = ImVec4(1.0f, 1.0f, 1.0f, 1.0f))
    {
        Name = name;
        Open = OpenPrev = open;
        Dirty = false;
        WantClose = false;
        Color = color;
    }